

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSphere.cpp
# Opt level: O3

void InternalSphere::Statistics
               (dgSphere *sphere,dgVector *eigenValues,dgVector *scaleVector,HaF32 *vertex,
               HaI32 vertexCount,HaI32 stride)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  ulong uVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  dgMatrix *initialGuess;
  HaF32 *pHVar10;
  HaI32 HVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  float fVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 in_XMM20 [16];
  
  if (vertexCount < 1) {
    dVar23 = 0.0;
    dVar24 = 0.0;
    dVar25 = 0.0;
    dVar12 = 0.0;
    dVar29 = 0.0;
    dVar26 = 0.0;
    dVar30 = 0.0;
    auVar19 = ZEXT816(0);
  }
  else {
    uVar1 = (scaleVector->super_dgTemplateVector<float>).m_y;
    uVar3 = (scaleVector->super_dgTemplateVector<float>).m_z;
    auVar35._8_8_ = 0x7fffffffffffffff;
    auVar35._0_8_ = 0x7fffffffffffffff;
    auVar21._8_8_ = 0x7fefffffffffffff;
    auVar21._0_8_ = 0x7fefffffffffffff;
    pHVar10 = vertex + 1;
    dVar23 = 0.0;
    dVar24 = 0.0;
    dVar30 = 0.0;
    dVar26 = 0.0;
    dVar29 = 0.0;
    auVar20 = ZEXT816(0);
    dVar25 = 0.0;
    auVar19 = ZEXT816(0);
    HVar11 = vertexCount;
    do {
      fVar22 = (scaleVector->super_dgTemplateVector<float>).m_x * (float)pHVar10[-1];
      auVar17._0_4_ = (float)*(undefined8 *)pHVar10 * (float)uVar1;
      auVar17._4_4_ = (float)((ulong)*(undefined8 *)pHVar10 >> 0x20) * (float)uVar3;
      auVar17._8_8_ = 0;
      auVar13 = vmovshdup_avx512vl(auVar17);
      dVar12 = ABS((double)fVar22);
      uVar4 = (long)dVar12 + 0x8010000000000001;
      auVar13 = vucomiss_avx512f(auVar13);
      if ((POPCOUNT(uVar4 & 0xff) & 1U) == 0) {
LAB_008572f9:
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x159,
                      "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)"
                     );
      }
      auVar5 = vcvtps2pd_avx(auVar17);
      auVar14 = vpand_avx(auVar5,auVar35);
      uVar6 = vpcmpgtq_avx512vl(auVar14,auVar21);
      if (((((uVar6 & 3) >> 1 != 0) || (NAN(auVar17._0_4_))) ||
          (uVar4 != 0 && 0x7feffffffffffffe < (long)dVar12)) || ((uVar6 & 1) != 0))
      goto LAB_008572f9;
      auVar14 = vmulps_avx512vl(auVar17,auVar17);
      auVar15 = vmovshdup_avx512vl(auVar14);
      dVar12 = ABS((double)(fVar22 * fVar22));
      uVar4 = (long)dVar12 + 0x8010000000000001;
      vucomiss_avx512f(auVar15);
      if ((POPCOUNT(uVar4 & 0xff) & 1U) == 0) goto LAB_008572f9;
      auVar15 = vcvtps2pd_avx512vl(auVar14);
      auVar16 = vpandq_avx512vl(auVar15,auVar35);
      uVar6 = vpcmpgtq_avx512vl(auVar16,auVar21);
      uVar9 = (uVar6 & 3) >> 1;
      if (((uVar9 != 0) || (vucomiss_avx512f(auVar14), uVar9 == 0)) ||
         ((uVar4 != 0 && 0x7feffffffffffffe < (long)dVar12 || ((uVar6 & 1) != 0))))
      goto LAB_008572f9;
      auVar14 = vmulss_avx512f(ZEXT416((uint)fVar22),auVar17);
      auVar16 = vmulss_avx512f(ZEXT416((uint)fVar22),auVar13);
      auVar13 = vmulss_avx512f(auVar17,auVar13);
      auVar17 = vcvtss2sd_avx512f(auVar14,auVar14);
      auVar14 = vcvtss2sd_avx512f(auVar16,auVar16);
      auVar18 = vcvtss2sd_avx512f(auVar13,auVar13);
      dVar12 = ABS(auVar18._0_8_);
      uVar4 = (long)dVar12 + 0x8010000000000001;
      vucomiss_avx512f(auVar13);
      if ((((POPCOUNT(uVar4 & 0xff) & 1U) == 0) ||
          (uVar4 != 0 && 0x7feffffffffffffe < (ulong)dVar12)) ||
         ((vucomiss_avx512f(auVar16), uVar4 == 0 || 0x7feffffffffffffe >= (ulong)dVar12 ||
          ((0x7fefffffffffffff < (auVar17._0_8_ & 0x7fffffffffffffff) ||
           (0x7fefffffffffffff < (ulong)ABS(auVar14._0_8_))))))) goto LAB_008572f9;
      dVar25 = (double)fVar22 + dVar25;
      dVar23 = auVar5._0_8_ + dVar23;
      dVar24 = auVar5._8_8_ + dVar24;
      auVar19 = vaddpd_avx512vl(auVar19,auVar15);
      dVar30 = (double)(fVar22 * fVar22) + dVar30;
      auVar20 = vaddsd_avx512f(auVar20,auVar17);
      dVar12 = auVar20._0_8_;
      dVar29 = auVar14._0_8_ + dVar29;
      dVar26 = auVar18._0_8_ + dVar26;
      pHVar10 = pHVar10 + stride;
      HVar11 = HVar11 + -1;
    } while (HVar11 != 0);
  }
  auVar20 = vcvtsi2sd_avx512f(in_XMM20,vertexCount);
  dVar34 = 1.0 / auVar20._0_8_;
  if ((long)ABS(dVar34 * dVar30) < 0x7ff0000000000000) {
    auVar13._0_8_ = dVar34 * auVar19._0_8_;
    auVar13._8_8_ = dVar34 * auVar19._8_8_;
    auVar19._8_4_ = 0xffffffff;
    auVar19._0_8_ = 0x7fffffffffffffff;
    auVar19._12_4_ = 0x7fffffff;
    auVar19 = vandpd_avx512vl(auVar13,auVar19);
    auVar20._8_4_ = 0xffffffff;
    auVar20._0_8_ = 0x7fefffffffffffff;
    auVar20._12_4_ = 0x7fefffff;
    uVar4 = vpcmpgtq_avx512vl(auVar19,auVar20);
    if (((uVar4 & 1) == 0) && ((uVar4 & 3) >> 1 == 0)) {
      if (((long)ABS(dVar34 * dVar12) < 0x7ff0000000000000) &&
         ((((long)ABS(dVar34 * dVar29) < 0x7ff0000000000000 &&
           ((long)ABS(dVar34 * dVar26) < 0x7ff0000000000000)) &&
          ((long)ABS(dVar34 * dVar25) < 0x7ff0000000000000)))) {
        auVar15._0_8_ = dVar34 * dVar23;
        auVar15._8_8_ = dVar34 * dVar24;
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0x7fffffffffffffff;
        auVar5._12_4_ = 0x7fffffff;
        auVar19 = vandpd_avx512vl(auVar15,auVar5);
        auVar14._8_4_ = 0xffffffff;
        auVar14._0_8_ = 0x7fefffffffffffff;
        auVar14._12_4_ = 0x7fefffff;
        uVar4 = vpcmpgtq_avx512vl(auVar19,auVar14);
        if (((uVar4 & 1) == 0) && ((uVar4 & 3) >> 1 == 0)) {
          auVar16._8_8_ = 0;
          auVar16._0_8_ = dVar34 * dVar25;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = dVar34 * dVar30;
          auVar20 = vfnmadd231sd_fma(auVar32,auVar16,auVar16);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = dVar34 * dVar12;
          auVar35 = vfnmadd231sd_fma(auVar18,auVar16,auVar15);
          auVar19 = vshufpd_avx(auVar15,auVar15,1);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = dVar34 * dVar29;
          auVar21 = vfnmadd231sd_fma(auVar33,auVar19,auVar16);
          fVar28 = (float)auVar35._0_8_;
          fVar22 = (float)auVar21._0_8_;
          if ((!NAN(fVar22)) &&
             ((((uint)ABS(fVar22) < 0x7f800000 && (!NAN(fVar28))) &&
              (((uint)ABS(fVar28) < 0x7f800000 && ((uint)ABS((float)auVar20._0_8_) < 0x7f800000)))))
             ) {
            auVar31._8_8_ = auVar15._0_8_;
            auVar31._0_8_ = auVar15._0_8_;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = dVar34 * dVar26;
            auVar35 = vunpcklpd_avx(auVar13,auVar27);
            (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_x =
                 (float)auVar20._0_8_;
            (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_y = fVar28;
            (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_z = fVar22;
            (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_w = 0.0;
            auVar20 = vfnmadd231pd_fma(auVar35,auVar15,auVar31);
            auVar20 = vcvtpd2ps_avx(auVar20);
            auVar35 = vmovshdup_avx(auVar20);
            if (!NAN(auVar35._0_4_)) {
              auVar7._8_4_ = 0x7fffffff;
              auVar7._0_8_ = 0x7fffffff7fffffff;
              auVar7._12_4_ = 0x7fffffff;
              auVar21 = vandps_avx512vl(auVar20,auVar7);
              auVar8._8_4_ = 0x7f7fffff;
              auVar8._0_8_ = 0x7f7fffff7f7fffff;
              auVar8._12_4_ = 0x7f7fffff;
              uVar4 = vpcmpgtd_avx512vl(auVar21,auVar8);
              if ((((uVar4 & 0xf) >> 1 & 1) == 0) && ((uVar4 & 1) == 0)) {
                auVar21 = vshufpd_avx(auVar13,auVar13,1);
                (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_x = fVar28;
                uVar2 = vmovlps_avx(auVar20);
                (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y = (float)(int)uVar2;
                (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z =
                     (float)(int)((ulong)uVar2 >> 0x20);
                (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_w = 0.0;
                auVar19 = vfnmadd213sd_fma(auVar19,auVar19,auVar21);
                if ((uint)ABS((float)auVar19._0_8_) < 0x7f800000) {
                  (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_x = fVar22;
                  (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_y = auVar35._0_4_
                  ;
                  (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_z =
                       (float)auVar19._0_8_;
                  (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_w = 0.0;
                  initialGuess = dgGetIdentityMatrix();
                  dgMatrix::EigenVectors(&sphere->super_dgMatrix,eigenValues,initialGuess);
                  return;
                }
              }
            }
          }
          __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                        ,0x134,
                        "dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
        }
      }
    }
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
}

Assistant:

static void Statistics (dgSphere &sphere, dgVector &eigenValues, dgVector &scaleVector, const hacd::HaF32 vertex[], hacd::HaI32 vertexCount, hacd::HaI32 stride)
	{
		dgBigVector var (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgBigVector cov (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgBigVector massCenter (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
	
		const hacd::HaF32* ptr = vertex;
		for (hacd::HaI32 i = 0; i < vertexCount; i ++) {
			hacd::HaF32 x = ptr[0] * scaleVector.m_x;
			hacd::HaF32 y = ptr[1] * scaleVector.m_y;
			hacd::HaF32 z = ptr[2] * scaleVector.m_z;
			ptr += stride;
			massCenter += dgBigVector (x, y, z, hacd::HaF32 (0.0f));
			var += dgBigVector (x * x, y * y, z * z, hacd::HaF32 (0.0f));
			cov += dgBigVector (x * y, x * z, y * z, hacd::HaF32 (0.0f));
		}
	
		hacd::HaF64 k = hacd::HaF64 (1.0) / vertexCount;
		var = var.Scale (k);
		cov = cov.Scale (k);
		massCenter = massCenter.Scale (k);
	
		hacd::HaF64 Ixx = var.m_x - massCenter.m_x * massCenter.m_x;
		hacd::HaF64 Iyy = var.m_y - massCenter.m_y * massCenter.m_y;
		hacd::HaF64 Izz = var.m_z - massCenter.m_z * massCenter.m_z;
	
		hacd::HaF64 Ixy = cov.m_x - massCenter.m_x * massCenter.m_y;
		hacd::HaF64 Ixz = cov.m_y - massCenter.m_x * massCenter.m_z;
		hacd::HaF64 Iyz = cov.m_z - massCenter.m_y * massCenter.m_z;
	
		sphere.m_front = dgVector (hacd::HaF32(Ixx), hacd::HaF32(Ixy), hacd::HaF32(Ixz), hacd::HaF32 (0.0f));
		sphere.m_up    = dgVector (hacd::HaF32(Ixy), hacd::HaF32(Iyy), hacd::HaF32(Iyz), hacd::HaF32 (0.0f));
		sphere.m_right = dgVector (hacd::HaF32(Ixz), hacd::HaF32(Iyz), hacd::HaF32(Izz), hacd::HaF32 (0.0f));
 		sphere.EigenVectors (eigenValues);
	}